

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu383.c
# Opt level: O0

RK_S32 GetRelativeDist(DXVA_PicParams_AV1 *dxva,RK_S32 a,RK_S32 b)

{
  uint uVar1;
  RK_S32 m;
  RK_S32 diff;
  RK_S32 bits;
  RK_S32 b_local;
  RK_S32 a_local;
  DXVA_PicParams_AV1 *dxva_local;
  
  if (dxva->order_hint_bits == '\0') {
    dxva_local._4_4_ = 0;
  }
  else {
    uVar1 = 1 << (dxva->order_hint_bits - 1 & 0x1f);
    dxva_local._4_4_ = (a - b & uVar1 - 1) - (a - b & uVar1);
  }
  return dxva_local._4_4_;
}

Assistant:

static RK_S32 GetRelativeDist(DXVA_PicParams_AV1 *dxva, RK_S32 a, RK_S32 b)
{
    if (!dxva->order_hint_bits) return 0;
    const RK_S32 bits = dxva->order_hint_bits - 1;

    RK_S32 diff = a - b;
    RK_S32 m = 1 << bits;
    diff = (diff & (m - 1)) - (diff & m);
    return diff;
}